

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::run(CPU *this)

{
  memory *this_00;
  order *poVar1;
  
  this_00 = &this->CPU_MEM;
  do {
    IF(this);
    (**this->current_order->_vptr_order)(this->current_order,this_00,this);
    poVar1 = this->current_order;
    if (poVar1->EX_need == true) {
      (*poVar1->_vptr_order[1])(poVar1,this_00,this);
      poVar1 = this->current_order;
    }
    if (poVar1->MEM_need == true) {
      (*poVar1->_vptr_order[2])(poVar1,this_00,this);
      poVar1 = this->current_order;
    }
    if (poVar1->WB_need == true) {
      (*poVar1->_vptr_order[3])(poVar1,this_00,this);
    }
    if ((this->CPU_MEM).jump_flag == false) {
      memory::jump(this_00,4);
    }
    else {
      (this->CPU_MEM).jump_flag = false;
    }
    operator_delete(this->current_order,0x20);
  } while( true );
}

Assistant:

void CPU::run() {
    while(true) {
        IF();
        ID();
        if (current_order->EX_need)
            EX();
        if (current_order->MEM_need)
            MEM();
        if (current_order->WB_need)
            WB();
        if(!CPU_MEM.jump_flag) CPU_MEM.jump(4);
        else CPU_MEM.jump_flag=false;
         delete current_order;
    }
}